

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

const_iterator __thiscall toml::detail::location::line_end(location *this)

{
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> _Var1;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((this->iter_)._M_current,
                     (((this->source_).
                       super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  return (const_iterator)_Var1._M_current;
}

Assistant:

const_iterator line_end() const noexcept
    {
        return std::find(this->iter(), this->end(), '\n');
    }